

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusSignature>::erase
          (QMovableArrayOps<QDBusSignature> *this,QDBusSignature *b,qsizetype n)

{
  QArrayDataPointer<QDBusSignature> *__src;
  QArrayDataPointer<QDBusSignature> *pQVar1;
  QDBusSignature *pQVar2;
  long in_RDX;
  QArrayDataPointer<QDBusSignature> *in_RSI;
  long in_RDI;
  QDBusSignature *e;
  QDBusSignature *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QDBusSignature> *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  std::destroy<QDBusSignature*>
            ((QDBusSignature *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QDBusSignature> *)
           QArrayDataPointer<QDBusSignature>::begin((QArrayDataPointer<QDBusSignature> *)0x1dce57);
  if ((in_RSI == pQVar1) &&
     (pQVar1 = (QArrayDataPointer<QDBusSignature> *)
               QArrayDataPointer<QDBusSignature>::end(in_stack_ffffffffffffffb0), __src != pQVar1))
  {
    *(QArrayDataPointer<QDBusSignature> **)(in_RDI + 8) = __src;
  }
  else {
    pQVar1 = (QArrayDataPointer<QDBusSignature> *)
             QArrayDataPointer<QDBusSignature>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar1) {
      pQVar2 = QArrayDataPointer<QDBusSignature>::end(in_RSI);
      memmove(in_RSI,__src,(((long)pQVar2 - (long)__src) / 0x18) * 0x18);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }